

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdr.cpp
# Opt level: O1

void __thiscall neueda::cdr::setDateTime(cdr *this,cdrKey_t *key,time_t value)

{
  tm tm;
  time_t local_d8;
  cdrItem local_d0;
  tm local_50;
  
  local_d8 = value;
  gmtime_r(&local_d8,&local_50);
  local_d0.mString._M_dataplus._M_p = (pointer)&local_d0.mString.field_2;
  local_d0.mKey = 0;
  local_d0.mPair = (itemPair *)0x0;
  local_d0.mType = CDR_DATETIME;
  local_d0.mString._M_string_length = 0;
  local_d0.mString.field_2._M_local_buf[0] = '\0';
  local_d0.mArray.super__Vector_base<neueda::cdr,_std::allocator<neueda::cdr>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.mArray.super__Vector_base<neueda::cdr,_std::allocator<neueda::cdr>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.mArray.super__Vector_base<neueda::cdr,_std::allocator<neueda::cdr>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0.mDateTime.mNanosecond = 0;
  local_d0.mDouble = 0.0;
  local_d0.mInteger = 0;
  local_d0.mDateTime.mMinute = local_50.tm_min;
  local_d0.mDateTime.mHour = local_50.tm_hour;
  local_d0.mDateTime.mSecond = local_50.tm_sec;
  local_d0.mDateTime.mDay = local_50.tm_mday;
  local_d0.mDateTime.mMonth = local_50.tm_mon + 1;
  local_d0.mDateTime.mYear = local_50.tm_year + 0x76c;
  setItem(this,key,&local_d0);
  cdrItem::~cdrItem(&local_d0);
  return;
}

Assistant:

void
cdr::setDateTime (const cdrKey_t& key, time_t value)
{
    tm tm;
    gmtime_r (&value, &tm);
    cdrItem item (CDR_DATETIME);
    item.mDateTime.mHour = tm.tm_hour;
    item.mDateTime.mMinute = tm.tm_min;
    item.mDateTime.mSecond = tm.tm_sec;
    item.mDateTime.mDay = tm.tm_mday;
    item.mDateTime.mMonth = tm.tm_mon + 1;
    item.mDateTime.mYear = tm.tm_year + 1900;
    setItem (key, item);
}